

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

double cross_entropy<unsigned_int,unsigned_int>
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *P,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *Q)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  pointer puVar8;
  ulong uVar9;
  ushort uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 extraout_var [56];
  undefined1 auVar19 [64];
  undefined1 in_XMM6 [16];
  double local_38;
  double local_28;
  
  puVar8 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_28 = 0.0;
  local_38 = 0.0;
  if (puVar8 != puVar2) {
    auVar13 = vpbroadcastq_avx512f();
    auVar13 = vpsrlq_avx512f(auVar13,2);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    uVar9 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar16 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar19,auVar14);
      auVar19 = vporq_avx512f(auVar19,auVar15);
      uVar5 = vpcmpuq_avx512f(auVar19,auVar13,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar17,auVar13,2);
      bVar7 = (byte)uVar5;
      uVar10 = CONCAT11(bVar7,bVar6);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar8 + uVar9));
      auVar17._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar19._4_4_;
      auVar17._0_4_ = (uint)(bVar6 & 1) * auVar19._0_4_;
      auVar17._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar19._8_4_;
      auVar17._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar19._12_4_;
      auVar17._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar19._16_4_;
      auVar17._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar19._20_4_;
      auVar17._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar19._24_4_;
      auVar17._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar19._28_4_;
      auVar17._32_4_ = (uint)(bVar7 & 1) * auVar19._32_4_;
      auVar17._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar19._36_4_;
      auVar17._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar19._40_4_;
      auVar17._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar19._44_4_;
      auVar17._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar19._48_4_;
      auVar17._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar19._52_4_;
      auVar17._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar19._56_4_;
      auVar17._60_4_ = (uint)(bVar7 >> 7) * auVar19._60_4_;
      auVar19 = vpaddd_avx512f(auVar17,auVar16);
      uVar9 = uVar9 + 0x10;
    } while ((((ulong)((long)puVar2 + (-4 - (long)puVar8)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
             uVar9);
    auVar13 = vmovdqa32_avx512f(auVar19);
    auVar14._0_4_ = (uint)(bVar6 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar16._0_4_;
    bVar3 = (bool)((byte)(uVar10 >> 1) & 1);
    auVar14._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar16._4_4_;
    bVar3 = (bool)((byte)(uVar10 >> 2) & 1);
    auVar14._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar16._8_4_;
    bVar3 = (bool)((byte)(uVar10 >> 3) & 1);
    auVar14._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar16._12_4_;
    bVar3 = (bool)((byte)(uVar10 >> 4) & 1);
    auVar14._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar16._16_4_;
    bVar3 = (bool)((byte)(uVar10 >> 5) & 1);
    auVar14._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar16._20_4_;
    bVar3 = (bool)((byte)(uVar10 >> 6) & 1);
    auVar14._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar16._24_4_;
    bVar3 = (bool)((byte)(uVar10 >> 7) & 1);
    auVar14._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar16._28_4_;
    auVar14._32_4_ = (uint)(bVar7 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar16._32_4_;
    bVar3 = (bool)(bVar7 >> 1 & 1);
    auVar14._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar16._36_4_;
    bVar3 = (bool)(bVar7 >> 2 & 1);
    auVar14._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar16._40_4_;
    bVar3 = (bool)(bVar7 >> 3 & 1);
    auVar14._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar16._44_4_;
    bVar3 = (bool)(bVar7 >> 4 & 1);
    auVar14._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar16._48_4_;
    bVar3 = (bool)(bVar7 >> 5 & 1);
    auVar14._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar16._52_4_;
    bVar3 = (bool)(bVar7 >> 6 & 1);
    auVar14._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar16._56_4_;
    auVar14._60_4_ =
         (uint)(bVar7 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar16._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar14,1);
    auVar13 = vpaddd_avx512f(auVar14,ZEXT3264(auVar12));
    auVar11 = vpaddd_avx(auVar13._0_16_,auVar13._16_16_);
    auVar4 = vpshufd_avx(auVar11,0xee);
    auVar11 = vpaddd_avx(auVar11,auVar4);
    auVar4 = vpshufd_avx(auVar11,0x55);
    auVar11 = vpaddd_avx(auVar11,auVar4);
    auVar11 = vcvtdq2pd_avx(auVar11);
    local_38 = auVar11._0_8_;
  }
  puVar8 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar8 != puVar2) {
    auVar13 = vpbroadcastq_avx512f();
    auVar13 = vpsrlq_avx512f(auVar13,2);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    uVar9 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar16 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar19,auVar14);
      auVar19 = vporq_avx512f(auVar19,auVar15);
      uVar5 = vpcmpuq_avx512f(auVar19,auVar13,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar17,auVar13,2);
      bVar7 = (byte)uVar5;
      uVar10 = CONCAT11(bVar7,bVar6);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar8 + uVar9));
      auVar18._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar19._4_4_;
      auVar18._0_4_ = (uint)(bVar6 & 1) * auVar19._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar19._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar19._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar19._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar19._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar19._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar19._28_4_;
      auVar18._32_4_ = (uint)(bVar7 & 1) * auVar19._32_4_;
      auVar18._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar19._36_4_;
      auVar18._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar19._40_4_;
      auVar18._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar19._44_4_;
      auVar18._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar19._48_4_;
      auVar18._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar19._52_4_;
      auVar18._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar19._56_4_;
      auVar18._60_4_ = (uint)(bVar7 >> 7) * auVar19._60_4_;
      auVar19 = vpaddd_avx512f(auVar18,auVar16);
      uVar9 = uVar9 + 0x10;
    } while ((((ulong)((long)puVar2 + (-4 - (long)puVar8)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
             uVar9);
    auVar13 = vmovdqa32_avx512f(auVar19);
    auVar15._0_4_ = (uint)(bVar6 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar16._0_4_;
    bVar3 = (bool)((byte)(uVar10 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar16._4_4_;
    bVar3 = (bool)((byte)(uVar10 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar16._8_4_;
    bVar3 = (bool)((byte)(uVar10 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar16._12_4_;
    bVar3 = (bool)((byte)(uVar10 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar16._16_4_;
    bVar3 = (bool)((byte)(uVar10 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar16._20_4_;
    bVar3 = (bool)((byte)(uVar10 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar16._24_4_;
    bVar3 = (bool)((byte)(uVar10 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar16._28_4_;
    auVar15._32_4_ = (uint)(bVar7 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar16._32_4_;
    bVar3 = (bool)(bVar7 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar16._36_4_;
    bVar3 = (bool)(bVar7 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar16._40_4_;
    bVar3 = (bool)(bVar7 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar16._44_4_;
    bVar3 = (bool)(bVar7 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar16._48_4_;
    bVar3 = (bool)(bVar7 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar16._52_4_;
    bVar3 = (bool)(bVar7 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar16._56_4_;
    auVar15._60_4_ =
         (uint)(bVar7 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar16._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar15,1);
    auVar13 = vpaddd_avx512f(auVar15,ZEXT3264(auVar12));
    auVar11 = vpaddd_avx(auVar13._0_16_,auVar13._16_16_);
    auVar4 = vpshufd_avx(auVar11,0xee);
    auVar11 = vpaddd_avx(auVar11,auVar4);
    auVar4 = vpshufd_avx(auVar11,0x55);
    auVar11 = vpaddd_avx(auVar11,auVar4);
    auVar11 = vcvtdq2pd_avx(auVar11);
    local_28 = auVar11._0_8_;
  }
  puVar8 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar8) {
    auVar11 = ZEXT816(0) << 0x40;
  }
  else {
    auVar13 = ZEXT864(0) << 0x40;
    uVar9 = 0;
    do {
      if ((puVar8[uVar9] != 0) &&
         (uVar1 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar9], uVar1 != 0)) {
        auVar4 = vcvtusi2sd_avx512f(in_XMM6,puVar8[uVar9]);
        auVar11 = vcvtusi2sd_avx512f(in_XMM6,uVar1);
        auVar19._0_8_ = log2(auVar11._0_8_ / local_28);
        auVar19._8_56_ = extraout_var;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auVar4._0_8_ / local_38;
        auVar11 = vfmadd231sd_fma(auVar13._0_16_,auVar19._0_16_,auVar11);
        auVar13 = ZEXT1664(auVar11);
      }
      auVar11 = auVar13._0_16_;
      uVar9 = uVar9 + 1;
      puVar8 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(P->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2));
  }
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar11,auVar4);
  return auVar11._0_8_;
}

Assistant:

double cross_entropy(const std::vector<X>& P, const std::vector<Y>& Q)
{
    double H0 = 0.0;
    double n = std::accumulate(std::begin(P), std::end(P), 0);
    double m = std::accumulate(std::begin(Q), std::end(Q), 0);
    for (size_t i = 0; i < P.size(); i++) {
        if (P[i] != 0 && Q[i] != 0) {
            double p = double(P[i]) / n;
            double q = double(Q[i]) / m;
            H0 += (p * log2(q));
        }
    }
    return -H0;
}